

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_PartiteGraph.cpp
# Opt level: O2

void __thiscall
PartiteGraphTest_test_add_vertex_Test::PartiteGraphTest_test_add_vertex_Test
          (PartiteGraphTest_test_add_vertex_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0013b1d8;
  return;
}

Assistant:

TEST(PartiteGraphTest, test_add_vertex) {
    graph::PartiteGraph<int, Vertex, Edge> graph;

    EXPECT_EQ(graph.get_partition<0>().size(), 0);
    graph.add_vertex<vertex_partition>(0, {"vertex 0"});
    EXPECT_EQ(graph.get_partition<0>().size(), 1);

    EXPECT_EQ(graph.get_partition<1>().size(), 0);
    graph.add_vertex<edge_partition>(1, {0.5});
    EXPECT_EQ(graph.get_partition<1>().size(), 1);
}